

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result
utf8_toUtf8(ENCODING *UNUSED_enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char *fromLimInitial;
  char *from;
  char *to;
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *UNUSED_enc_local;
  
  toP_local = (char **)fromLim;
  fromLim_local = (char *)fromP;
  fromP_local = (char **)UNUSED_enc;
  align_limit_to_full_utf8_characters(*fromP,(char **)&toP_local);
  from = *toP;
  for (fromLimInitial = *(char **)fromLim_local; fromLimInitial < toP_local && from < toLim;
      fromLimInitial = fromLimInitial + 1) {
    *from = *fromLimInitial;
    from = from + 1;
  }
  *(char **)fromLim_local = fromLimInitial;
  *toP = from;
  if (toP_local < fromLim) {
    UNUSED_enc_local._4_4_ = XML_CONVERT_INPUT_INCOMPLETE;
  }
  else if ((from == toLim) && (fromLimInitial < toP_local)) {
    UNUSED_enc_local._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
  }
  else {
    UNUSED_enc_local._4_4_ = XML_CONVERT_COMPLETED;
  }
  return UNUSED_enc_local._4_4_;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf8(const ENCODING *UNUSED_P(enc),
            const char **fromP, const char *fromLim,
            char **toP, const char *toLim)
{
  char *to;
  const char *from;
  const char *fromLimInitial = fromLim;

  /* Avoid copying partial characters. */
  align_limit_to_full_utf8_characters(*fromP, &fromLim);

  for (to = *toP, from = *fromP; (from < fromLim) && (to < toLim); from++, to++)
    *to = *from;
  *fromP = from;
  *toP = to;

  if (fromLim < fromLimInitial)
    return XML_CONVERT_INPUT_INCOMPLETE;
  else if ((to == toLim) && (from < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}